

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::SubpassDescription::SubpassDescription
          (SubpassDescription *this,VkPipelineBindPoint _pipelineBindPoint,
          VkSubpassDescriptionFlags _flags,deUint32 _inputAttachmentCount,
          VkAttachmentReference *_inputAttachments,deUint32 _colorAttachmentCount,
          VkAttachmentReference *_colorAttachments,VkAttachmentReference *_resolveAttachments,
          VkAttachmentReference depthStencilAttachment,deUint32 _preserveAttachmentCount,
          deUint32 *_preserveAttachments)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer puVar3;
  pointer puVar4;
  allocator_type local_59;
  pointer local_58;
  pointer pVStack_50;
  pointer local_48;
  VkSubpassDescriptionFlags local_34;
  
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_resolveAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_resolveAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_resolveAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_34 = _flags;
  std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
  vector<vk::VkAttachmentReference_const*,void>
            ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)
             &local_58,_inputAttachments,_inputAttachments + _inputAttachmentCount,&local_59);
  pVVar1 = (this->m_inputAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->m_inputAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = local_58;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = pVStack_50;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_48;
  local_58 = (pointer)0x0;
  pVStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)pVVar2 - (long)pVVar1);
    if (local_58 != (pointer)0x0) {
      operator_delete(local_58,(long)local_48 - (long)local_58);
    }
  }
  std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
  vector<vk::VkAttachmentReference_const*,void>
            ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)
             &local_58,_colorAttachments,_colorAttachments + _colorAttachmentCount,&local_59);
  pVVar1 = (this->m_colorAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->m_colorAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = local_58;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = pVStack_50;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_48;
  local_58 = (pointer)0x0;
  pVStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)pVVar2 - (long)pVVar1);
    if (local_58 != (pointer)0x0) {
      operator_delete(local_58,(long)local_48 - (long)local_58);
    }
  }
  if (_resolveAttachments != (VkAttachmentReference *)0x0) {
    std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
    vector<vk::VkAttachmentReference_const*,void>
              ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)
               &local_58,_resolveAttachments,_resolveAttachments + _colorAttachmentCount,&local_59);
    pVVar1 = (this->m_resolveAttachments).
             super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar2 = (this->m_resolveAttachments).
             super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_resolveAttachments).
    super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
    _M_impl.super__Vector_impl_data._M_start = local_58;
    (this->m_resolveAttachments).
    super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVStack_50;
    (this->m_resolveAttachments).
    super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_48;
    local_58 = (pointer)0x0;
    pVStack_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
    if (pVVar1 != (pointer)0x0) {
      operator_delete(pVVar1,(long)pVVar2 - (long)pVVar1);
      if (local_58 != (pointer)0x0) {
        operator_delete(local_58,(long)local_48 - (long)local_58);
      }
    }
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,_preserveAttachments,
             _preserveAttachments + _preserveAttachmentCount,(allocator_type *)&local_59);
  puVar3 = (this->m_preserveAttachments).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->m_preserveAttachments).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = &local_58->attachment;
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = &pVStack_50->attachment;
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = &local_48->attachment;
  local_58 = (pointer)0x0;
  pVStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
    if (local_58 != (pointer)0x0) {
      operator_delete(local_58,(long)local_48 - (long)local_58);
    }
  }
  this->m_depthStencilAttachment = depthStencilAttachment;
  (this->super_VkSubpassDescription).flags = local_34;
  (this->super_VkSubpassDescription).pipelineBindPoint = _pipelineBindPoint;
  (this->super_VkSubpassDescription).inputAttachmentCount = _inputAttachmentCount;
  (this->super_VkSubpassDescription).pInputAttachments = (VkAttachmentReference *)0x0;
  (this->super_VkSubpassDescription).colorAttachmentCount = _colorAttachmentCount;
  (this->super_VkSubpassDescription).pColorAttachments = (VkAttachmentReference *)0x0;
  (this->super_VkSubpassDescription).pResolveAttachments = (VkAttachmentReference *)0x0;
  (this->super_VkSubpassDescription).pDepthStencilAttachment = &this->m_depthStencilAttachment;
  (this->super_VkSubpassDescription).pPreserveAttachments = (deUint32 *)0x0;
  (this->super_VkSubpassDescription).preserveAttachmentCount = _preserveAttachmentCount;
  pVVar1 = (this->m_inputAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->m_inputAttachments).
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pInputAttachments = pVVar1;
  }
  pVVar1 = (this->m_colorAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->m_colorAttachments).
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pColorAttachments = pVVar1;
  }
  pVVar1 = (this->m_resolveAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->m_resolveAttachments).
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pResolveAttachments = pVVar1;
  }
  puVar3 = (this->m_preserveAttachments).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (this->m_preserveAttachments).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pPreserveAttachments = puVar3;
  }
  return;
}

Assistant:

SubpassDescription::SubpassDescription (vk::VkPipelineBindPoint				_pipelineBindPoint,
										vk::VkSubpassDescriptionFlags		_flags,
										deUint32							_inputAttachmentCount,
										const vk::VkAttachmentReference*	_inputAttachments,
										deUint32							_colorAttachmentCount,
										const vk::VkAttachmentReference*	_colorAttachments,
										const vk::VkAttachmentReference*	_resolveAttachments,
										vk::VkAttachmentReference			depthStencilAttachment,
										deUint32							_preserveAttachmentCount,
										const deUint32*						_preserveAttachments)
{
	m_inputAttachments = std::vector<vk::VkAttachmentReference>(_inputAttachments, _inputAttachments + _inputAttachmentCount);
	m_colorAttachments = std::vector<vk::VkAttachmentReference>(_colorAttachments, _colorAttachments + _colorAttachmentCount);

	if (_resolveAttachments)
		m_resolveAttachments = std::vector<vk::VkAttachmentReference>(_resolveAttachments, _resolveAttachments + _colorAttachmentCount);

	m_preserveAttachments = std::vector<deUint32>(_preserveAttachments, _preserveAttachments + _preserveAttachmentCount);

	m_depthStencilAttachment = depthStencilAttachment;

	flags					= _flags;
	pipelineBindPoint		= _pipelineBindPoint;
	inputAttachmentCount	= _inputAttachmentCount;
	pInputAttachments		= DE_NULL;
	colorAttachmentCount	= _colorAttachmentCount;
	pColorAttachments		= DE_NULL;
	pResolveAttachments		= DE_NULL;
	pDepthStencilAttachment	= &m_depthStencilAttachment;
	pPreserveAttachments	= DE_NULL;
	preserveAttachmentCount	= _preserveAttachmentCount;

	if (!m_inputAttachments.empty())
		pInputAttachments = &m_inputAttachments[0];

	if (!m_colorAttachments.empty())
		pColorAttachments = &m_colorAttachments[0];

	if (!m_resolveAttachments.empty())
		pResolveAttachments = &m_resolveAttachments[0];

	if (!m_preserveAttachments.empty())
		pPreserveAttachments = &m_preserveAttachments[0];
}